

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

bitset_t * bitset_copy(bitset_t *bitset)

{
  uint64_t *puVar1;
  undefined8 *in_RDI;
  bitset_t *copy;
  bitset_t *local_8;
  
  local_8 = (bitset_t *)roaring_malloc(0x12ee5b);
  if (local_8 == (bitset_t *)0x0) {
    local_8 = (bitset_t *)0x0;
  }
  else {
    local_8->array = (uint64_t *)*in_RDI;
    local_8->arraysize = in_RDI[1];
    local_8->capacity = in_RDI[2];
    local_8->capacity = local_8->arraysize;
    puVar1 = (uint64_t *)roaring_malloc(0x12eeb4);
    local_8->array = puVar1;
    if (puVar1 == (uint64_t *)0x0) {
      roaring_free((void *)0x12eeca);
      local_8 = (bitset_t *)0x0;
    }
    else {
      memcpy(local_8->array,(void *)*in_RDI,in_RDI[1] << 3);
    }
  }
  return local_8;
}

Assistant:

bitset_t *bitset_copy(const bitset_t *bitset) {
    bitset_t *copy = NULL;
    /* Allocate the bitset itself. */
    if ((copy = (bitset_t *)roaring_malloc(sizeof(bitset_t))) == NULL) {
        return NULL;
    }
    memcpy(copy, bitset, sizeof(bitset_t));
    copy->capacity = copy->arraysize;
    if ((copy->array = (uint64_t *)roaring_malloc(sizeof(uint64_t) *
                                                  bitset->arraysize)) == NULL) {
        roaring_free(copy);
        return NULL;
    }
    memcpy(copy->array, bitset->array, sizeof(uint64_t) * bitset->arraysize);
    return copy;
}